

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O3

void __thiscall cmCTestSubmitCommand::CheckArguments(cmCTestSubmitCommand *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  
  if ((this->Parts).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    _Var6._M_current =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          &(this->Parts).
           super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_payload._M_value.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar1 = *(pointer *)
              ((long)&(this->Parts).
                      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_payload._M_value.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8);
    lVar5 = (long)pbVar1 - (long)_Var6._M_current;
    if (0 < lVar5 >> 7) {
      lVar3 = (lVar5 >> 7) + 1;
      do {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)this,_Var6);
        _Var4._M_current = _Var6._M_current;
        if (bVar2) goto LAB_0058ee4b;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)this,
                           _Var6._M_current + 1);
        _Var4._M_current = _Var6._M_current + 1;
        if (bVar2) goto LAB_0058ee4b;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)this,
                           _Var6._M_current + 2);
        _Var4._M_current = _Var6._M_current + 2;
        if (bVar2) goto LAB_0058ee4b;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)this,
                           _Var6._M_current + 3);
        _Var4._M_current = _Var6._M_current + 3;
        if (bVar2) goto LAB_0058ee4b;
        _Var6._M_current = _Var6._M_current + 4;
        lVar3 = lVar3 + -1;
        lVar5 = lVar5 + -0x80;
      } while (1 < lVar3);
    }
    lVar5 = lVar5 >> 5;
    if (lVar5 == 1) {
LAB_0058ee37:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)this,_Var6);
      _Var4._M_current = _Var6._M_current;
      if (!bVar2) {
        _Var4._M_current = pbVar1;
      }
LAB_0058ee4b:
      _Var6._M_current = _Var4._M_current + 1;
      if (_Var6._M_current != pbVar1 && _Var4._M_current != pbVar1) {
        do {
          bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                  operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)this,_Var6);
          if (!bVar2) {
            std::__cxx11::string::operator=((string *)_Var4._M_current,(string *)_Var6._M_current);
            _Var4._M_current = _Var4._M_current + 1;
          }
          _Var6._M_current = _Var6._M_current + 1;
        } while (_Var6._M_current != pbVar1);
      }
    }
    else {
      if (lVar5 == 2) {
LAB_0058ee1e:
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)this,_Var6);
        _Var4._M_current = _Var6._M_current;
        if (!bVar2) {
          _Var6._M_current = _Var6._M_current + 1;
          goto LAB_0058ee37;
        }
        goto LAB_0058ee4b;
      }
      _Var4._M_current = pbVar1;
      if (lVar5 == 3) {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)this,_Var6);
        _Var4._M_current = _Var6._M_current;
        if (!bVar2) {
          _Var6._M_current = _Var6._M_current + 1;
          goto LAB_0058ee1e;
        }
        goto LAB_0058ee4b;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&this->Parts,(iterator)_Var4._M_current,
               *(pointer *)
                ((long)&(this->Parts).
                        super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_payload._M_value.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                + 8));
  }
  if ((this->Files).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged != true) {
    return;
  }
  _Var6._M_current =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &(this->Files).
         super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_payload._M_value.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  pbVar1 = *(pointer *)
            ((long)&(this->Files).
                    super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_payload._M_value.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            + 8);
  lVar5 = (long)pbVar1 - (long)_Var6._M_current;
  if (0 < lVar5 >> 7) {
    lVar3 = (lVar5 >> 7) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)this,_Var6);
      _Var4._M_current = _Var6._M_current;
      if (bVar2) goto LAB_0058efb6;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)this,
                         _Var6._M_current + 1);
      _Var4._M_current = _Var6._M_current + 1;
      if (bVar2) goto LAB_0058efb6;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)this,
                         _Var6._M_current + 2);
      _Var4._M_current = _Var6._M_current + 2;
      if (bVar2) goto LAB_0058efb6;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)this,
                         _Var6._M_current + 3);
      _Var4._M_current = _Var6._M_current + 3;
      if (bVar2) goto LAB_0058efb6;
      _Var6._M_current = _Var6._M_current + 4;
      lVar3 = lVar3 + -1;
      lVar5 = lVar5 + -0x80;
    } while (1 < lVar3);
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 == 1) {
LAB_0058efa2:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)this,_Var6);
    _Var4._M_current = _Var6._M_current;
    if (!bVar2) {
      _Var4._M_current = pbVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_0058ef89:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)this,_Var6);
    _Var4._M_current = _Var6._M_current;
    if (!bVar2) {
      _Var6._M_current = _Var6._M_current + 1;
      goto LAB_0058efa2;
    }
  }
  else {
    _Var4._M_current = pbVar1;
    if (lVar5 != 3) goto LAB_0058effb;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)this,_Var6);
    _Var4._M_current = _Var6._M_current;
    if (!bVar2) {
      _Var6._M_current = _Var6._M_current + 1;
      goto LAB_0058ef89;
    }
  }
LAB_0058efb6:
  _Var6._M_current = _Var4._M_current + 1;
  if (_Var6._M_current != pbVar1 && _Var4._M_current != pbVar1) {
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)this,_Var6);
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)_Var4._M_current,(string *)_Var6._M_current);
        _Var4._M_current = _Var4._M_current + 1;
      }
      _Var6._M_current = _Var6._M_current + 1;
    } while (_Var6._M_current != pbVar1);
  }
LAB_0058effb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->Files,(iterator)_Var4._M_current,
             *(pointer *)
              ((long)&(this->Files).
                      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_payload._M_value.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8));
  return;
}

Assistant:

void cmCTestSubmitCommand::CheckArguments()
{
  if (this->Parts) {
    cm::erase_if(*(this->Parts), [this](std::string const& arg) -> bool {
      cmCTest::Part p = this->CTest->GetPartFromName(arg);
      if (p == cmCTest::PartCount) {
        std::ostringstream e;
        e << "Part name \"" << arg << "\" is invalid.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return true;
      }
      return false;
    });
  }

  if (this->Files) {
    cm::erase_if(*(this->Files), [this](std::string const& arg) -> bool {
      if (!cmSystemTools::FileExists(arg)) {
        std::ostringstream e;
        e << "File \"" << arg << "\" does not exist. Cannot submit "
          << "a non-existent file.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return true;
      }
      return false;
    });
  }
}